

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.h
# Opt level: O3

void __thiscall psy::C::SemanticModelTester::~SemanticModelTester(SemanticModelTester *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  std::
  vector<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>,_std::allocator<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_>_>
  ::~vector(&this->tests_);
  std::unique_ptr<psy::C::Compilation,_std::default_delete<psy::C::Compilation>_>::~unique_ptr
            (&this->compilation_);
  std::unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::~unique_ptr
            (&this->tree_);
  (this->super_Tester)._vptr_Tester = (_func_int **)&PTR__Tester_005222f8;
  pcVar2 = (this->super_Tester).curTestFunc_._M_dataplus._M_p;
  paVar1 = &(this->super_Tester).curTestFunc_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x60);
  return;
}

Assistant:

SemanticModelTester(TestSuite* suite) : Tester(suite) {}